

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QTextLength> * __thiscall
QList<QTextLength>::fill(QList<QTextLength> *this,parameter_type t,qsizetype newSize)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  qreal qVar3;
  Type TVar4;
  Data *pDVar5;
  QArrayData *pQVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  qreal qVar9;
  QTextLength *pQVar10;
  QTextLength *pQVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar5 = (this->d).d;
  lVar12 = newSize;
  if (pDVar5 != (Data *)0x0) {
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar5 == (Data *)0x0) {
        lVar13 = 0;
      }
      else {
        lVar13 = (pDVar5->super_QArrayData).alloc;
      }
      if (newSize <= lVar13) {
        TVar4 = t->lengthType;
        uVar2 = *(undefined4 *)&t->field_0x4;
        qVar3 = t->fixedValueOrPercentage;
        lVar12 = (this->d).size;
        if (newSize <= lVar12) {
          lVar12 = newSize;
        }
        if (lVar12 != 0) {
          pQVar11 = (this->d).ptr;
          lVar13 = 0;
          do {
            qVar9 = t->fixedValueOrPercentage;
            puVar1 = (undefined8 *)((long)&pQVar11->lengthType + lVar13);
            *puVar1 = *(undefined8 *)t;
            puVar1[1] = qVar9;
            lVar13 = lVar13 + 0x10;
          } while (lVar12 * 0x10 != lVar13);
        }
        lVar12 = (this->d).size;
        if (lVar12 < newSize) {
          if (newSize != lVar12) {
            pQVar11 = (this->d).ptr + lVar12;
            (this->d).size = newSize;
            lVar12 = lVar12 - newSize;
            do {
              pQVar11->lengthType = TVar4;
              *(undefined4 *)&pQVar11->field_0x4 = uVar2;
              pQVar11->fixedValueOrPercentage = qVar3;
              pQVar11 = pQVar11 + 1;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0);
          }
        }
        else if (newSize < lVar12) {
          (this->d).size = newSize;
        }
        goto LAB_004d6fd1;
      }
    }
    if (pDVar5 != (Data *)0x0) {
      lVar12 = (pDVar5->super_QArrayData).alloc;
      if (lVar12 <= newSize) {
        lVar12 = newSize;
      }
      if (((pDVar5->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
        lVar12 = newSize;
      }
    }
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = (QTextLength *)QArrayData::allocate(&local_30,0x10,0x10,lVar12,KeepSize);
  pQVar11 = pQVar10;
  lVar12 = newSize;
  if (newSize == 0) {
    newSize = 0;
  }
  else {
    do {
      uVar2 = *(undefined4 *)&t->field_0x4;
      uVar7 = *(undefined4 *)&t->fixedValueOrPercentage;
      uVar8 = *(undefined4 *)((long)&t->fixedValueOrPercentage + 4);
      pQVar11->lengthType = t->lengthType;
      *(undefined4 *)&pQVar11->field_0x4 = uVar2;
      *(undefined4 *)&pQVar11->fixedValueOrPercentage = uVar7;
      *(undefined4 *)((long)&pQVar11->fixedValueOrPercentage + 4) = uVar8;
      lVar12 = lVar12 + -1;
      pQVar11 = pQVar11 + 1;
    } while (lVar12 != 0);
  }
  pQVar6 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_30;
  (this->d).ptr = pQVar10;
  (this->d).size = newSize;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,0x10,0x10);
    }
  }
LAB_004d6fd1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}